

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_shortcut.cxx
# Opt level: O1

uint Fl_Widget::label_shortcut(char *t)

{
  byte bVar1;
  uint uVar2;
  
  if (t == (char *)0x0) {
    return 0;
  }
  do {
    bVar1 = *t;
    if (bVar1 == 0x26) {
      t = (char *)((byte *)t + 1);
      uVar2 = fl_utf8decode(t,(char *)0x0,(wchar_t *)0x0);
      if (uVar2 != 0x26) {
        return uVar2;
      }
    }
    else if (bVar1 == 0) {
      return (uint)bVar1;
    }
    t = (char *)((byte *)t + 1);
  } while( true );
}

Assistant:

unsigned int Fl_Widget::label_shortcut(const char *t) {
  if (!t) return 0;
  for (;;) {
    if (*t==0) return 0;
    if (*t=='&') {
      unsigned int s = fl_utf8decode(t+1, 0, 0);
      if (s==0) return 0;
      else if (s==(unsigned int)'&') t++;
      else return s;
    }
    t++;
  }
}